

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_encoder.cc
# Opt level: O3

bool __thiscall draco::MeshSequentialEncoder::CompressAndEncodeIndices(MeshSequentialEncoder *this)

{
  Mesh *pMVar1;
  pointer paVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices_buffer;
  uint32_t encoded_val;
  uint32_t *local_68;
  iterator iStack_60;
  uint *local_58;
  uint local_44;
  MeshSequentialEncoder *local_40;
  ulong local_38;
  
  local_68 = (uint32_t *)0x0;
  iStack_60._M_current = (uint *)0x0;
  local_58 = (uint *)0x0;
  pMVar1 = (this->super_MeshEncoder).mesh_;
  uVar4 = ((long)(pMVar1->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pMVar1->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  iVar7 = 0;
  local_40 = this;
  if ((int)uVar4 != 0) {
    local_38 = uVar4 & 0xffffffff;
    lVar6 = 0;
    uVar4 = 0;
    do {
      paVar2 = (((local_40->super_MeshEncoder).mesh_)->faces_).vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = 0;
      iVar8 = iVar7;
      do {
        iVar7 = *(int *)((long)(paVar2->_M_elems + lVar9) + lVar6);
        uVar5 = iVar7 - iVar8;
        uVar3 = -uVar5;
        if (0 < (int)uVar5) {
          uVar3 = uVar5;
        }
        local_44 = uVar3 << 1 | uVar5 >> 0x1f;
        if (iStack_60._M_current == local_58) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                     &local_44);
        }
        else {
          *iStack_60._M_current = local_44;
          iStack_60._M_current = iStack_60._M_current + 1;
        }
        lVar9 = lVar9 + 1;
        iVar8 = iVar7;
      } while (lVar9 != 3);
      uVar4 = uVar4 + 1;
      lVar6 = lVar6 + 0xc;
    } while (uVar4 != local_38);
  }
  EncodeSymbols(local_68,(int)((ulong)((long)iStack_60._M_current - (long)local_68) >> 2),1,
                (Options *)0x0,(local_40->super_MeshEncoder).super_PointCloudEncoder.buffer_);
  if (local_68 != (uint32_t *)0x0) {
    operator_delete(local_68,(long)local_58 - (long)local_68);
  }
  return true;
}

Assistant:

bool MeshSequentialEncoder::CompressAndEncodeIndices() {
  // Collect all indices to a buffer and encode them.
  // Each new index is a difference from the previous value.
  std::vector<uint32_t> indices_buffer;
  int32_t last_index_value = 0;
  const int num_faces = mesh()->num_faces();
  for (FaceIndex i(0); i < num_faces; ++i) {
    const auto &face = mesh()->face(i);
    for (int j = 0; j < 3; ++j) {
      const int32_t index_value = face[j].value();
      const int32_t index_diff = index_value - last_index_value;
      // Encode signed value to an unsigned one (put the sign to lsb pos).
      const uint32_t encoded_val =
          (abs(index_diff) << 1) | (index_diff < 0 ? 1 : 0);
      indices_buffer.push_back(encoded_val);
      last_index_value = index_value;
    }
  }
  EncodeSymbols(indices_buffer.data(), static_cast<int>(indices_buffer.size()),
                1, nullptr, buffer());
  return true;
}